

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int cm_zlib_gzungetc(int c,gzFile file)

{
  int iVar1;
  uchar *local_30;
  uchar *dest;
  uchar *src;
  gz_statep state;
  gzFile file_local;
  int c_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = -1;
  }
  else {
    if (((file[1].have == 0x1c4f) && (*(int *)((long)&file[2].pos + 4) == 0)) && (file->have == 0))
    {
      gz_look((gz_statep)file);
    }
    if ((file[1].have == 0x1c4f) &&
       ((*(int *)((long)&file[4].pos + 4) == 0 || (*(int *)((long)&file[4].pos + 4) == -5)))) {
      if ((int)file[4].pos != 0) {
        *(undefined4 *)&file[4].pos = 0;
        iVar1 = gz_skip((gz_statep)file,(off_t)file[4].next);
        if (iVar1 == -1) {
          return -1;
        }
      }
      if (c < 0) {
        file_local._4_4_ = -1;
      }
      else {
        file_local._4_4_ = c;
        if (file->have == 0) {
          file->have = 1;
          file->next = file[2].next + ((ulong)(uint)((int)file[1].pos << 1) - 1);
          *file->next = (uchar)c;
          file->pos = file->pos + -1;
          *(undefined4 *)((long)&file[3].next + 4) = 0;
        }
        else if (file->have == (int)file[1].pos * 2) {
          cm_zlib_gz_error((gz_statep)file,-3,"out of room to push characters");
          file_local._4_4_ = -1;
        }
        else {
          if (file->next == file[2].next) {
            local_30 = file[2].next + (uint)((int)file[1].pos << 1);
            dest = file[2].next + file->have;
            while (file[2].next < dest) {
              local_30[-1] = dest[-1];
              local_30 = local_30 + -1;
              dest = dest + -1;
            }
            file->next = local_30;
          }
          file->have = file->have + 1;
          file->next = file->next + -1;
          *file->next = (uchar)c;
          file->pos = file->pos + -1;
          *(undefined4 *)((long)&file[3].next + 4) = 0;
        }
      }
    }
    else {
      file_local._4_4_ = -1;
    }
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzungetc(int c, gzFile file) {
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* in case this was just opened, set up the input buffer */
    if (state->mode == GZ_READ && state->how == LOOK && state->x.have == 0)
        (void)gz_look(state);

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ ||
        (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return -1;

    /* process a skip request */
    if (state->seek) {
        state->seek = 0;
        if (gz_skip(state, state->skip) == -1)
            return -1;
    }

    /* can't push EOF */
    if (c < 0)
        return -1;

    /* if output buffer empty, put byte at end (allows more pushing) */
    if (state->x.have == 0) {
        state->x.have = 1;
        state->x.next = state->out + (state->size << 1) - 1;
        state->x.next[0] = (unsigned char)c;
        state->x.pos--;
        state->past = 0;
        return c;
    }

    /* if no room, give up (must have already done a gzungetc()) */
    if (state->x.have == (state->size << 1)) {
        gz_error(state, Z_DATA_ERROR, "out of room to push characters");
        return -1;
    }

    /* slide output data if needed and insert byte before existing data */
    if (state->x.next == state->out) {
        unsigned char *src = state->out + state->x.have;
        unsigned char *dest = state->out + (state->size << 1);
        while (src > state->out)
            *--dest = *--src;
        state->x.next = dest;
    }
    state->x.have++;
    state->x.next--;
    state->x.next[0] = (unsigned char)c;
    state->x.pos--;
    state->past = 0;
    return c;
}